

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O0

char * __thiscall cali::Attribute::name_c_str(Attribute *this)

{
  cali_id_t cVar1;
  char *pcVar2;
  cali_variant_t local_30;
  Node *local_20;
  Node *node;
  Attribute *this_local;
  
  local_20 = this->m_node;
  node = (Node *)this;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      return (char *)0x0;
    }
    cVar1 = Node::attribute(local_20);
    if (cVar1 == 8) break;
    local_20 = util::LockfreeIntrusiveTree<cali::Node>::parent
                         (&local_20->super_LockfreeIntrusiveTree<cali::Node>);
  }
  local_30 = (cali_variant_t)Node::data(local_20);
  pcVar2 = (char *)Variant::data((Variant *)&local_30);
  return pcVar2;
}

Assistant:

const char* Attribute::name_c_str() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == NAME_ATTR_ID)
            return static_cast<const char*>(node->data().data());

    return nullptr;
}